

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleRowDown34_1_Box_16_C(uint16_t *src_ptr,ptrdiff_t src_stride,uint16_t *d,int dst_width)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint16_t b2;
  uint16_t b1;
  uint16_t b0;
  uint16_t a2;
  uint16_t a1;
  uint16_t a0;
  int x;
  uint16_t *t;
  uint16_t *s;
  int dst_width_local;
  uint16_t *d_local;
  ptrdiff_t src_stride_local;
  uint16_t *src_ptr_local;
  
  t = src_ptr + src_stride;
  s = src_ptr;
  d_local = d;
  for (x = 0; x < dst_width; x = x + 3) {
    uVar1 = s[1];
    uVar2 = s[2];
    uVar3 = s[2];
    uVar4 = s[3];
    uVar5 = t[1];
    uVar6 = t[2];
    uVar7 = t[2];
    uVar8 = t[3];
    *d_local = (uint16_t)
               ((int)(((int)((uint)*s * 3 + (uint)s[1] + 2) >> 2 & 0xffffU) +
                      ((int)((uint)*t * 3 + (uint)t[1] + 2) >> 2 & 0xffffU) + 1) >> 1);
    d_local[1] = (uint16_t)
                 ((int)(((int)((uint)uVar1 + (uint)uVar2 + 1) >> 1 & 0xffffU) +
                        ((int)((uint)uVar5 + (uint)uVar6 + 1) >> 1 & 0xffffU) + 1) >> 1);
    d_local[2] = (uint16_t)
                 ((int)(((int)((uint)uVar3 + (uint)uVar4 * 3 + 2) >> 2 & 0xffffU) +
                        ((int)((uint)uVar7 + (uint)uVar8 * 3 + 2) >> 2 & 0xffffU) + 1) >> 1);
    d_local = d_local + 3;
    s = s + 4;
    t = t + 4;
  }
  return;
}

Assistant:

void ScaleRowDown34_1_Box_16_C(const uint16_t* src_ptr,
                               ptrdiff_t src_stride,
                               uint16_t* d,
                               int dst_width) {
  const uint16_t* s = src_ptr;
  const uint16_t* t = src_ptr + src_stride;
  int x;
  assert((dst_width % 3 == 0) && (dst_width > 0));
  for (x = 0; x < dst_width; x += 3) {
    uint16_t a0 = (s[0] * 3 + s[1] * 1 + 2) >> 2;
    uint16_t a1 = (s[1] * 1 + s[2] * 1 + 1) >> 1;
    uint16_t a2 = (s[2] * 1 + s[3] * 3 + 2) >> 2;
    uint16_t b0 = (t[0] * 3 + t[1] * 1 + 2) >> 2;
    uint16_t b1 = (t[1] * 1 + t[2] * 1 + 1) >> 1;
    uint16_t b2 = (t[2] * 1 + t[3] * 3 + 2) >> 2;
    d[0] = (a0 + b0 + 1) >> 1;
    d[1] = (a1 + b1 + 1) >> 1;
    d[2] = (a2 + b2 + 1) >> 1;
    d += 3;
    s += 4;
    t += 4;
  }
}